

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::remove_filename(SmallVectorImpl<char> *path,Style style)

{
  undefined8 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  StringRef path_00;
  
  uVar1 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar2 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  path_00.Length._0_4_ = uVar2;
  path_00.Data = (char *)uVar1;
  path_00.Length._4_4_ = 0;
  sVar3 = anon_unknown.dwarf_1e49a5::parent_path_end(path_00,style);
  if (sVar3 != 0xffffffffffffffff) {
    if ((path->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < sVar3) {
      __assert_fail("Size <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (path->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)sVar3;
  }
  return;
}

Assistant:

void remove_filename(SmallVectorImpl<char> &path, Style style) {
  size_t end_pos = parent_path_end(StringRef(path.begin(), path.size()), style);
  if (end_pos != StringRef::npos)
    path.set_size(end_pos);
}